

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O0

void nuts_tran_duplicate_listen(char *scheme)

{
  _Bool _Var1;
  nng_err nVar2;
  int iVar3;
  nng_err num;
  char *pcVar4;
  char *pcVar5;
  nng_err result__4;
  nng_err result__3;
  nng_err result__2;
  nng_err result__1;
  nng_err result_;
  nng_url *url;
  char *addr;
  nng_listener local_18;
  nng_listener l2;
  nng_listener l1;
  nng_socket s;
  char *scheme_local;
  
  memset(&l2,0,4);
  memset(&local_18,0,4);
  memset((void *)((long)&addr + 4),0,4);
  pcVar4 = strchr(scheme,0x36);
  if ((pcVar4 == (char *)0x0) || (_Var1 = nuts_has_ipv6(), _Var1)) {
    nuts_scratch_addr_zero(scheme,0x40,nuts_tran_duplicate_listen::nuts_addr_);
    url = (nng_url *)nuts_tran_duplicate_listen::nuts_addr_;
    nVar2 = nng_pair1_open((nng_socket *)&l2);
    pcVar4 = nng_strerror(nVar2);
    iVar3 = acutest_check_((uint)(nVar2 == NNG_OK),
                           "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/testing/util.c"
                           ,0x129,"%s: expected success, got %s (%d)","nng_pair1_open(&(s))",pcVar4,
                           nVar2);
    if (iVar3 == 0) {
      acutest_abort_();
    }
    nVar2 = nng_listen((nng_socket)l2.id,(char *)url,&local_18,0);
    pcVar4 = nng_strerror(nVar2);
    iVar3 = acutest_check_((uint)(nVar2 == NNG_OK),
                           "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/testing/util.c"
                           ,0x12a,"%s: expected success, got %s (%d)","nng_listen(s, addr, &l1, 0)",
                           pcVar4,nVar2);
    if (iVar3 == 0) {
      acutest_abort_();
    }
    nVar2 = nng_listener_get_url(local_18,(nng_url **)&result__1);
    pcVar4 = nng_strerror(nVar2);
    iVar3 = acutest_check_((uint)(nVar2 == NNG_OK),
                           "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/testing/util.c"
                           ,299,"%s: expected success, got %s (%d)","nng_listener_get_url(l1, &url)"
                           ,pcVar4,nVar2);
    if (iVar3 == 0) {
      acutest_abort_();
    }
    num = nng_listen_url((nng_socket)l2.id,_result__1,(nng_listener *)((long)&addr + 4),0);
    pcVar4 = nng_strerror(NNG_EADDRINUSE);
    acutest_check_((uint)(num == NNG_EADDRINUSE),
                   "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/testing/util.c"
                   ,300,"%s fails with %s","nng_listen_url(s, url, &l2, 0)",pcVar4,nVar2);
    pcVar4 = nng_strerror(NNG_EADDRINUSE);
    pcVar5 = nng_strerror(num);
    acutest_message_("%s: expected %s (%d), got %s (%d)","nng_listen_url(s, url, &l2, 0)",pcVar4,10,
                     pcVar5,(ulong)num);
    iVar3 = nng_listener_id(local_18);
    acutest_check_((uint)(0 < iVar3),
                   "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/testing/util.c"
                   ,0x12d,"%s","nng_listener_id(l1) > 0");
    iVar3 = nng_listener_id(addr._4_4_);
    acutest_check_((uint)(iVar3 < 0),
                   "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/testing/util.c"
                   ,0x12e,"%s","nng_listener_id(l2) < 0");
    nVar2 = nng_socket_close((nng_socket)l2.id);
    pcVar4 = nng_strerror(nVar2);
    iVar3 = acutest_check_((uint)(nVar2 == NNG_OK),
                           "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/testing/util.c"
                           ,0x12f,"%s: expected success, got %s (%d)","nng_socket_close(s)",pcVar4,
                           nVar2);
    if (iVar3 == 0) {
      acutest_abort_();
    }
  }
  else {
    acutest_skip_("/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/testing/util.c"
                  ,0x127,"No IPv6 support present");
  }
  return;
}

Assistant:

void
nuts_tran_duplicate_listen(const char *scheme)
{
	nng_socket     s  = NNG_SOCKET_INITIALIZER;
	nng_listener   l1 = NNG_LISTENER_INITIALIZER;
	nng_listener   l2 = NNG_LISTENER_INITIALIZER;
	const char    *addr;
	const nng_url *url;

	NUTS_SKIP_IF_IPV6_NEEDED_AND_ABSENT(scheme);
	NUTS_ADDR_ZERO(addr, scheme);
	NUTS_OPEN(s);
	NUTS_PASS(nng_listen(s, addr, &l1, 0));
	NUTS_PASS(nng_listener_get_url(l1, &url));
	NUTS_FAIL(nng_listen_url(s, url, &l2, 0), NNG_EADDRINUSE);
	NUTS_TRUE(nng_listener_id(l1) > 0);
	NUTS_TRUE(nng_listener_id(l2) < 0);
	NUTS_CLOSE(s);
}